

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

void __thiscall
rpn::VarRefExpression<rpn::CacheVarRefExpression>::Evaluate
          (VarRefExpression<rpn::CacheVarRefExpression> *this,EvaluationContext *context)

{
  reference this_00;
  reference pvVar1;
  undefined1 local_40 [8];
  string variableValue;
  value_type *variableName;
  EvaluationContext *context_local;
  VarRefExpression<rpn::CacheVarRefExpression> *this_local;
  
  ConcatExpression::Evaluate(&this->super_ConcatExpression,context);
  variableValue.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::back(&context->results);
  CacheVarRefExpression::GetVariableValue
            ((string *)local_40,(CacheVarRefExpression *)this,(string *)variableValue.field_2._8_8_)
  ;
  this_00 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::back(&context->results);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&context->resultsCount);
  *pvVar1 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Evaluate(EvaluationContext& context) const override
    {
        ConcatExpression::Evaluate(context);

        const auto& variableName = context.results.back();
        auto variableValue =
            static_cast<const T&>(*this).GetVariableValue(variableName);

        // since we know that we need to push/pop exactly one argument to/from
        // both stacks, we can just rewrite last element
        context.results.back() = std::move(variableValue);
        context.resultsCount.back() = 1;
    }